

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O3

void __thiscall Rml::Element::OnAttributeChange(Element *this,ElementAttributes *changed_attributes)

{
  Variant *this_00;
  EventDispatcher *this_01;
  undefined1 *puVar1;
  pointer ppVar2;
  char *pcVar3;
  pointer ppVar4;
  NodePtr pDVar5;
  EventListener *listener;
  ElementMeta *pEVar6;
  ulong uVar7;
  ulong *puVar8;
  EventId id;
  int iVar9;
  PropertyMap *this_02;
  difference_type __d;
  ulong uVar11;
  long lVar12;
  EventListener **ppEVar13;
  undefined8 uVar14;
  _Alloc_hider _Var15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  pointer ppVar17;
  uint8_t *puVar18;
  ulong *puVar19;
  pointer ppVar20;
  pair<Rml::PropertyId,_Rml::Property> *name_value;
  const_iterator cVar21;
  pair<__gnu_cxx::__normal_iterator<std::pair<Rml::EventId,_Rml::EventListener_*>_*,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>,_bool>
  pVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value_as_string;
  PropertyDictionary properties;
  undefined1 local_158 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_140;
  size_t local_130;
  _Alloc_hider local_128;
  int local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  ElementMeta *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  EventDispatcher *local_b8;
  undefined1 *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  String local_88;
  string *local_68;
  Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
  local_60;
  NodePtr pDVar10;
  
  ppVar20 = (changed_attributes->m_container).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (changed_attributes->m_container).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar20 != ppVar2) {
    local_b0 = local_158 + 0x10;
    local_68 = (string *)&this->id;
    do {
      paVar16 = &local_d8.field_2;
      this_00 = &ppVar20->second;
      iVar9 = ::std::__cxx11::string::compare((char *)ppVar20);
      if (iVar9 == 0) {
        local_d8._M_string_length = 0;
        local_d8.field_2._M_local_buf[0] = '\0';
        local_d8._M_dataplus._M_p = (pointer)paVar16;
        Variant::
        GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (this_00,&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p == paVar16) {
          aStack_140._0_8_ = local_d8.field_2._8_8_;
          local_158._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_158 + 0x10);
        }
        else {
          local_158._0_8_ = local_d8._M_dataplus._M_p;
        }
        local_158._17_7_ = local_d8.field_2._M_allocated_capacity._1_7_;
        local_158[0x10] = local_d8.field_2._M_local_buf[0];
        local_158._8_8_ = local_d8._M_string_length;
        local_d8._M_string_length = 0;
        local_d8.field_2._M_local_buf[0] = '\0';
        local_d8._M_dataplus._M_p = (pointer)paVar16;
        ::std::__cxx11::string::operator=(local_68,(string *)local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_158 + 0x10)) {
          operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar16) {
          uVar14 = CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                            local_d8.field_2._M_local_buf[0]);
          _Var15._M_p = local_d8._M_dataplus._M_p;
LAB_0021bb25:
          operator_delete(_Var15._M_p,uVar14 + 1);
        }
      }
      else {
        iVar9 = ::std::__cxx11::string::compare((char *)ppVar20);
        if (iVar9 == 0) {
          pEVar6 = this->meta;
          paVar16 = &local_f8.field_2;
          local_f8._M_string_length = 0;
          local_f8.field_2._M_local_buf[0] = '\0';
          local_f8._M_dataplus._M_p = (pointer)paVar16;
          Variant::
          GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (this_00,&local_f8);
          local_158._0_8_ = local_158 + 0x10;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p == paVar16) {
            aStack_140._0_8_ = local_f8.field_2._8_8_;
          }
          else {
            local_158._0_8_ = local_f8._M_dataplus._M_p;
          }
          local_158._17_7_ = local_f8.field_2._M_allocated_capacity._1_7_;
          local_158[0x10] = local_f8.field_2._M_local_buf[0];
          local_158._8_8_ = local_f8._M_string_length;
          local_f8._M_string_length = 0;
          local_f8.field_2._M_local_buf[0] = '\0';
          local_f8._M_dataplus._M_p = (pointer)paVar16;
          ElementStyle::SetClassNames(&pEVar6->style,(String *)local_158);
          if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
            operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != paVar16) {
            uVar14 = CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                              local_f8.field_2._M_local_buf[0]);
            _Var15._M_p = local_f8._M_dataplus._M_p;
            goto LAB_0021bb25;
          }
        }
        else {
          iVar9 = ::std::__cxx11::string::compare((char *)ppVar20);
          if ((((iVar9 == 0) ||
               (iVar9 = ::std::__cxx11::string::compare((char *)ppVar20), iVar9 == 0)) &&
              (((undefined1  [96])(this->meta->computed_values).common & (undefined1  [96])0xf) ==
               (undefined1  [96])0xd)) ||
             ((iVar9 = ::std::__cxx11::string::compare((char *)ppVar20), iVar9 == 0 &&
              ((byte)((*(byte *)&(this->meta->computed_values).common & 0xf) - 0xb) < 2)))) {
            (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[0x15])(this);
          }
          else if ((((ppVar20->first)._M_string_length < 3) ||
                   (pcVar3 = (ppVar20->first)._M_dataplus._M_p, *pcVar3 != 'o')) ||
                  (pcVar3[1] != 'n')) {
            iVar9 = ::std::__cxx11::string::compare((char *)ppVar20);
            if (iVar9 == 0) {
              if (this_00->type != NONE) {
                if (this_00->type != STRING) {
                  GetAddress_abi_cxx11_((String *)local_158,this,false,true);
                  Log::Message(LT_WARNING,
                               "Invalid \'style\' attribute, string type required. In element: %s",
                               local_158._0_8_);
                  goto LAB_0021bab3;
                }
                PropertyDictionary::PropertyDictionary((PropertyDictionary *)&local_60);
                StyleSheetParser::StyleSheetParser((StyleSheetParser *)local_158);
                StyleSheetParser::ParseProperties
                          ((StyleSheetParser *)local_158,(PropertyDictionary *)&local_60,
                           (String *)(ppVar20->second).data);
                this_02 = PropertyDictionary::GetProperties((PropertyDictionary *)&local_60);
                cVar21 = robin_hood::detail::
                         Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                         ::cbegin(this_02);
                pDVar10 = cVar21.mKeyVals;
                pDVar5 = (NodePtr)this_02->mInfo;
                while (pDVar10 != pDVar5) {
                  puVar18 = cVar21.mInfo;
                  pDVar10 = cVar21.mKeyVals;
                  ElementStyle::SetProperty
                            (&this->meta->style,(pDVar10->mData).first,&(pDVar10->mData).second);
                  pDVar10 = pDVar10 + 1;
                  uVar11 = *(ulong *)(puVar18 + 1);
                  if (uVar11 == 0) {
                    puVar8 = (ulong *)(puVar18 + 9);
                    do {
                      puVar19 = puVar8;
                      pDVar10 = pDVar10 + 8;
                      uVar11 = *puVar19;
                      puVar8 = puVar19 + 1;
                    } while (uVar11 == 0);
                  }
                  else {
                    puVar19 = (ulong *)(puVar18 + 1);
                  }
                  uVar7 = 0;
                  if (uVar11 != 0) {
                    for (; (uVar11 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                    }
                  }
                  uVar11 = uVar7 >> 3 & 0x1fffffff;
                  pDVar10 = pDVar10 + uVar11;
                  cVar21.mInfo = (uint8_t *)((long)puVar19 + uVar11);
                  cVar21.mKeyVals = pDVar10;
                }
                StyleSheetParser::~StyleSheetParser((StyleSheetParser *)local_158);
                robin_hood::detail::
                Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                ::destroy(&local_60);
              }
            }
            else {
              iVar9 = ::std::__cxx11::string::compare((char *)ppVar20);
              if (iVar9 == 0) {
                if (this_00->type != NONE) {
                  if (this_00->type != STRING) {
                    GetAddress_abi_cxx11_((String *)local_158,this,false,true);
                    Log::Message(LT_WARNING,
                                 "Invalid \'lang\' attribute, string type required. In element: %s",
                                 local_158._0_8_);
                    goto LAB_0021bb12;
                  }
                  pEVar6 = this->meta;
                  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
                  lVar12 = *(long *)(ppVar20->second).data;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_88,lVar12,
                             *(long *)((ppVar20->second).data + 8) + lVar12);
                  local_158._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x2d;
                  Variant::Set((Variant *)local_158,&local_88);
                  local_130 = 0xffffffff00000002;
                  local_118._M_allocated_capacity = 0;
                  local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  local_128._M_p = (pointer)0x0;
                  local_120 = -1;
                  ElementStyle::SetProperty(&pEVar6->style,RmlUi_Language,(Property *)local_158);
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
                  }
                  Variant::~Variant((Variant *)local_158);
                  uVar14 = local_88.field_2._M_allocated_capacity;
                  _Var15._M_p = local_88._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_88._M_dataplus._M_p != &local_88.field_2) goto LAB_0021bb25;
                }
              }
              else {
                iVar9 = ::std::__cxx11::string::compare((char *)ppVar20);
                if ((iVar9 == 0) && (this_00->type != NONE)) {
                  if (this_00->type == STRING) {
                    pcVar3 = (ppVar20->second).data;
                    iVar9 = ::std::__cxx11::string::compare(pcVar3);
                    if (iVar9 == 0) {
                      pEVar6 = this->meta;
                      local_158._0_8_ =
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)0x2d;
                      Variant::Set((Variant *)local_158,0);
                      local_130 = 0xffffffff00000001;
                      local_128._M_p = (pointer)0x0;
                      local_120 = -1;
                      local_118._M_allocated_capacity = 0;
                      local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      ElementStyle::SetProperty
                                (&pEVar6->style,RmlUi_Direction,(Property *)local_158);
                    }
                    else {
                      iVar9 = ::std::__cxx11::string::compare(pcVar3);
                      if (iVar9 == 0) {
                        pEVar6 = this->meta;
                        local_158._0_8_ =
                             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)0x2d;
                        Variant::Set((Variant *)local_158,1);
                        local_130 = 0xffffffff00000001;
                        local_128._M_p = (pointer)0x0;
                        local_120 = -1;
                        local_118._M_allocated_capacity = 0;
                        local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                        ElementStyle::SetProperty
                                  (&pEVar6->style,RmlUi_Direction,(Property *)local_158);
                      }
                      else {
                        iVar9 = ::std::__cxx11::string::compare(pcVar3);
                        if (iVar9 != 0) {
                          uVar14 = *(undefined8 *)pcVar3;
                          GetAddress_abi_cxx11_((String *)local_158,this,false,true);
                          Log::Message(LT_WARNING,
                                       "Invalid \'dir\' attribute \'%s\', value must be \'auto\', \'ltr\', or \'rtl\'. In element: %s"
                                       ,uVar14,local_158._0_8_);
                          goto LAB_0021bb12;
                        }
                        pEVar6 = this->meta;
                        local_158._0_8_ =
                             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)0x2d;
                        Variant::Set((Variant *)local_158,2);
                        local_130 = 0xffffffff00000001;
                        local_128._M_p = (pointer)0x0;
                        local_120 = -1;
                        local_118._M_allocated_capacity = 0;
                        local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                        ElementStyle::SetProperty
                                  (&pEVar6->style,RmlUi_Direction,(Property *)local_158);
                      }
                    }
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
                    }
                    Variant::~Variant((Variant *)local_158);
                  }
                  else {
                    GetAddress_abi_cxx11_((String *)local_158,this,false,true);
                    Log::Message(LT_WARNING,
                                 "Invalid \'dir\' attribute, string type required. In element: %s",
                                 local_158._0_8_);
LAB_0021bb12:
                    uVar14 = local_158._16_8_;
                    _Var15._M_p = (pointer)local_158._0_8_;
                    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) goto LAB_0021bb25;
                  }
                }
              }
            }
          }
          else {
            local_100 = this->meta;
            ::std::__cxx11::string::substr((ulong)local_158,(ulong)ppVar20);
            id = EventSpecificationInterface::GetIdOrInsert((String *)local_158);
            if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
              operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
            }
            this_01 = &local_100->event_dispatcher;
            if (this_00->type == NONE) {
              ppVar17 = (local_100->attribute_event_listeners).m_container.
                        super__Vector_base<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppVar4 = (local_100->attribute_event_listeners).m_container.
                       super__Vector_base<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              uVar11 = (long)ppVar4 - (long)ppVar17 >> 4;
              while (uVar7 = uVar11, 0 < (long)uVar7) {
                uVar11 = uVar7 >> 1;
                if (ppVar17[uVar11].first < id) {
                  ppVar17 = ppVar17 + uVar11 + 1;
                  uVar11 = ~uVar11 + uVar7;
                }
              }
              if ((ppVar17 != ppVar4) && (ppVar17->first <= id)) {
                EventDispatcher::DetachEvent(this_01,id,ppVar17->second,false);
                ppVar4 = (local_100->attribute_event_listeners).m_container.
                         super__Vector_base<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                if ((ppVar17 + 1 != ppVar4) &&
                   (lVar12 = (long)ppVar4 - (long)(ppVar17 + 1) >> 4, 0 < lVar12)) {
                  uVar11 = lVar12 + 1;
                  ppEVar13 = &ppVar17[1].second;
                  do {
                    *(EventId *)(ppEVar13 + -3) =
                         ((pair<Rml::EventId,_Rml::EventListener_*> *)(ppEVar13 + -1))->first;
                    ppEVar13[-2] = *ppEVar13;
                    uVar11 = uVar11 - 1;
                    ppEVar13 = ppEVar13 + 2;
                  } while (1 < uVar11);
                }
                (local_100->attribute_event_listeners).m_container.
                super__Vector_base<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = ppVar4 + -1;
              }
            }
            else if (this_00->type == STRING) {
              ppVar17 = (local_100->attribute_event_listeners).m_container.
                        super__Vector_base<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppVar4 = (local_100->attribute_event_listeners).m_container.
                       super__Vector_base<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              uVar11 = (long)ppVar4 - (long)ppVar17 >> 4;
              while (uVar7 = uVar11, 0 < (long)uVar7) {
                uVar11 = uVar7 >> 1;
                if (ppVar17[uVar11].first < id) {
                  ppVar17 = ppVar17 + uVar11 + 1;
                  uVar11 = ~uVar11 + uVar7;
                }
              }
              local_b8 = this_01;
              if ((ppVar17 != ppVar4) && (ppVar17->first <= id)) {
                EventDispatcher::DetachEvent(this_01,id,ppVar17->second,false);
                ppVar4 = (local_100->attribute_event_listeners).m_container.
                         super__Vector_base<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                if ((ppVar17 + 1 != ppVar4) &&
                   (lVar12 = (long)ppVar4 - (long)(ppVar17 + 1) >> 4, 0 < lVar12)) {
                  uVar11 = lVar12 + 1;
                  ppEVar13 = &ppVar17[1].second;
                  do {
                    *(EventId *)(ppEVar13 + -3) =
                         ((pair<Rml::EventId,_Rml::EventListener_*> *)(ppEVar13 + -1))->first;
                    ppEVar13[-2] = *ppEVar13;
                    uVar11 = uVar11 - 1;
                    ppEVar13 = ppEVar13 + 2;
                  } while (1 < uVar11);
                }
                (local_100->attribute_event_listeners).m_container.
                super__Vector_base<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = ppVar4 + -1;
              }
              paVar16 = &local_a8.field_2;
              local_a8._M_string_length = 0;
              local_a8.field_2._M_local_buf[0] = '\0';
              local_a8._M_dataplus._M_p = (pointer)paVar16;
              Variant::
              GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (this_00,&local_a8);
              local_158._0_8_ = local_158 + 0x10;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p == paVar16) {
                aStack_140._0_8_ = local_a8.field_2._8_8_;
              }
              else {
                local_158._0_8_ = local_a8._M_dataplus._M_p;
              }
              local_158._17_7_ = local_a8.field_2._M_allocated_capacity._1_7_;
              local_158[0x10] = local_a8.field_2._M_local_buf[0];
              local_158._8_8_ = local_a8._M_string_length;
              local_a8._M_string_length = 0;
              local_a8.field_2._M_local_buf[0] = '\0';
              local_a8._M_dataplus._M_p = (pointer)paVar16;
              local_60.mInfo = (uint8_t *)Factory::InstanceEventListener((String *)local_158,this);
              local_60.mKeyVals._0_2_ = id;
              pVar22 = itlib::
                       flat_map<Rml::EventId,Rml::EventListener*,itlib::fmimpl::less,std::vector<std::pair<Rml::EventId,Rml::EventListener*>,std::allocator<std::pair<Rml::EventId,Rml::EventListener*>>>>
                       ::insert<std::pair<Rml::EventId,Rml::EventListener*>>
                                 ((flat_map<Rml::EventId,Rml::EventListener*,itlib::fmimpl::less,std::vector<std::pair<Rml::EventId,Rml::EventListener*>,std::allocator<std::pair<Rml::EventId,Rml::EventListener*>>>>
                                   *)local_100,(pair<Rml::EventId,_Rml::EventListener_*> *)&local_60
                                 );
              listener = (pVar22.first._M_current._M_current)->second;
              if (listener != (EventListener *)0x0) {
                EventDispatcher::AttachEvent(local_b8,id,listener,false);
              }
LAB_0021bab3:
              uVar14 = local_158._16_8_;
              _Var15._M_p = (pointer)local_158._0_8_;
              if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) goto LAB_0021bb25;
            }
          }
        }
      }
      ppVar20 = ppVar20 + 1;
    } while (ppVar20 != ppVar2);
  }
  this->field_0x17 = this->field_0x17 | 2;
  if (this->parent != (Element *)0x0) {
    puVar1 = &this->parent->field_0x17;
    *puVar1 = *puVar1 | 4;
  }
  return;
}

Assistant:

void Element::OnAttributeChange(const ElementAttributes& changed_attributes)
{
	for (const auto& element_attribute : changed_attributes)
	{
		const auto& attribute = element_attribute.first;
		const auto& value = element_attribute.second;
		if (attribute == "id")
		{
			id = value.Get<String>();
		}
		else if (attribute == "class")
		{
			meta->style.SetClassNames(value.Get<String>());
		}
		else if (((attribute == "colspan" || attribute == "rowspan") && meta->computed_values.display() == Style::Display::TableCell) ||
			(attribute == "span" &&
				(meta->computed_values.display() == Style::Display::TableColumn ||
					meta->computed_values.display() == Style::Display::TableColumnGroup)))
		{
			DirtyLayout();
		}
		else if (attribute.size() > 2 && attribute[0] == 'o' && attribute[1] == 'n')
		{
			static constexpr bool IN_CAPTURE_PHASE = false;

			auto& attribute_event_listeners = meta->attribute_event_listeners;
			auto& event_dispatcher = meta->event_dispatcher;
			const auto event_id = EventSpecificationInterface::GetIdOrInsert(attribute.substr(2));
			const auto remove_event_listener_if_exists = [&attribute_event_listeners, &event_dispatcher, event_id]() {
				const auto listener_it = attribute_event_listeners.find(event_id);
				if (listener_it != attribute_event_listeners.cend())
				{
					event_dispatcher.DetachEvent(event_id, listener_it->second, IN_CAPTURE_PHASE);
					attribute_event_listeners.erase(listener_it);
				}
			};

			if (value.GetType() == Variant::Type::STRING)
			{
				remove_event_listener_if_exists();

				const auto value_as_string = value.Get<String>();
				auto insertion_result = attribute_event_listeners.emplace(event_id, Factory::InstanceEventListener(value_as_string, this));
				if (auto* listener = insertion_result.first->second)
					event_dispatcher.AttachEvent(event_id, listener, IN_CAPTURE_PHASE);
			}
			else if (value.GetType() == Variant::Type::NONE)
				remove_event_listener_if_exists();
		}
		else if (attribute == "style")
		{
			if (value.GetType() == Variant::STRING)
			{
				PropertyDictionary properties;
				StyleSheetParser parser;
				parser.ParseProperties(properties, value.GetReference<String>());

				for (const auto& name_value : properties.GetProperties())
					meta->style.SetProperty(name_value.first, name_value.second);
			}
			else if (value.GetType() != Variant::NONE)
				Log::Message(Log::LT_WARNING, "Invalid 'style' attribute, string type required. In element: %s", GetAddress().c_str());
		}
		else if (attribute == "lang")
		{
			if (value.GetType() == Variant::STRING)
				meta->style.SetProperty(PropertyId::RmlUi_Language, Property(value.GetReference<String>(), Unit::STRING));
			else if (value.GetType() != Variant::NONE)
				Log::Message(Log::LT_WARNING, "Invalid 'lang' attribute, string type required. In element: %s", GetAddress().c_str());
		}
		else if (attribute == "dir")
		{
			if (value.GetType() == Variant::STRING)
			{
				const String& dir_value = value.GetReference<String>();

				if (dir_value == "auto")
					meta->style.SetProperty(PropertyId::RmlUi_Direction, Property(Style::Direction::Auto));
				else if (dir_value == "ltr")
					meta->style.SetProperty(PropertyId::RmlUi_Direction, Property(Style::Direction::Ltr));
				else if (dir_value == "rtl")
					meta->style.SetProperty(PropertyId::RmlUi_Direction, Property(Style::Direction::Rtl));
				else
					Log::Message(Log::LT_WARNING, "Invalid 'dir' attribute '%s', value must be 'auto', 'ltr', or 'rtl'. In element: %s",
						dir_value.c_str(), GetAddress().c_str());
			}
			else if (value.GetType() != Variant::NONE)
				Log::Message(Log::LT_WARNING, "Invalid 'dir' attribute, string type required. In element: %s", GetAddress().c_str());
		}
	}

	// Any change to the attributes may affect which styles apply to the current element, in particular due to attribute selectors, ID selectors, and
	// class selectors. This can further affect all siblings or descendants due to sibling or descendant combinators.
	DirtyDefinition(DirtyNodes::SelfAndSiblings);
}